

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

void __thiscall Reader::processsections(Reader *this)

{
  Reader *in_RDI;
  Reader *in_stack_00000060;
  Reader *in_stack_000000c0;
  Reader *in_stack_000001e0;
  
  processnonesec(in_RDI);
  processobjsec(in_stack_000000c0);
  processconsec(in_stack_000000c0);
  processboundssec(in_stack_000001e0);
  processgensec(in_stack_00000060);
  processbinsec(in_stack_00000060);
  processsemisec(in_stack_00000060);
  processsossec(in_stack_000000c0);
  processendsec(in_RDI);
  return;
}

Assistant:

void Reader::processsections() {
  processnonesec();
  processobjsec();
  processconsec();
  processboundssec();
  processgensec();
  processbinsec();
  processsemisec();
  processsossec();
  processendsec();
}